

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
          (BasicResult<Catch::clara::detail::ParseState> *this,BasicResult<void> *other)

{
  Type TVar1;
  BasicResult<void> *in_RSI;
  BasicResult<Catch::clara::detail::ParseState> *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  Type in_stack_ffffffffffffffcc;
  
  detail::BasicResult<void>::type(in_RSI);
  ResultValueBase<Catch::clara::detail::ParseState>::ResultValueBase
            (&in_RDI->super_ResultValueBase<Catch::clara::detail::ParseState>,
             in_stack_ffffffffffffffcc);
  (in_RDI->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_004d4a60;
  detail::BasicResult<void>::errorMessage_abi_cxx11_
            ((BasicResult<void> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  TVar1 = type(in_RDI);
  if (TVar1 != Ok) {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                ,0x232b,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = void]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }